

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketGroup<SmallAllocationBlockAttributes>::PrepareSweep
          (HeapBucketGroup<SmallAllocationBlockAttributes> *this)

{
  HeapBucketGroup<SmallAllocationBlockAttributes> *this_local;
  
  HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>::PrepareSweep
            ((HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *)this);
  HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::PrepareSweep
            (&(this->leafHeapBucket).
              super_HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>);
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  PrepareSweep((HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                *)&this->smallNormalWithBarrierHeapBucket);
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  PrepareSweep((HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                *)&this->smallFinalizableWithBarrierHeapBucket);
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::PrepareSweep
            ((HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *)
             &this->finalizableHeapBucket);
  return;
}

Assistant:

void
HeapBucketGroup<TBlockAttributes>::PrepareSweep()
{
    heapBucket.PrepareSweep();
    leafHeapBucket.PrepareSweep();
#ifdef RECYCLER_WRITE_BARRIER
    smallNormalWithBarrierHeapBucket.PrepareSweep();
    smallFinalizableWithBarrierHeapBucket.PrepareSweep();
#endif
    finalizableHeapBucket.PrepareSweep();
#ifdef RECYCLER_VISITED_HOST
    recyclerVisitedHostHeapBucket.PrepareSweep();
#endif
}